

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train_sudoku.cpp
# Opt level: O3

void __thiscall TrainSudoku::addDependencies(TrainSudoku *this)

{
  initializer_list<std::pair<int,_int>_> __l;
  initializer_list<std::pair<int,_int>_> __l_00;
  initializer_list<std::pair<int,_int>_> __l_01;
  initializer_list<std::pair<int,_int>_> __l_02;
  initializer_list<std::pair<int,_int>_> __l_03;
  initializer_list<std::pair<int,_int>_> __l_04;
  allocator_type local_bc;
  less<std::pair<int,_int>_> local_bb;
  allocator_type local_ba;
  less<std::pair<int,_int>_> local_b9;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_b8;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_88;
  pair<int,_int> local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  pair<int,_int> local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  Sudoku::addDependencies(&this->super_Sudoku);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Add group dependencies",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  local_38.first = 3;
  local_38.second = 1;
  uStack_30 = 0x100000004;
  local_28 = 0x100000005;
  __l._M_len = 3;
  __l._M_array = &local_38;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)&local_88,__l,&local_b9,&local_ba);
  local_58.first = 0;
  local_58.second = 3;
  uStack_50 = 0x300000001;
  local_48 = 0x300000002;
  __l_00._M_len = 3;
  __l_00._M_array = &local_58;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)&local_b8,__l_00,&local_bb,&local_bc);
  addTrainDependencies
            (this,(set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   *)&local_88,
             (set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              *)&local_b8);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_b8);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_88);
  local_38.first = 6;
  local_38.second = 1;
  uStack_30 = 0x100000007;
  local_28 = 0x100000008;
  __l_01._M_len = 3;
  __l_01._M_array = &local_38;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)&local_88,__l_01,&local_b9,&local_ba);
  local_58.first = 3;
  local_58.second = 3;
  uStack_50 = 0x300000004;
  local_48 = 0x300000005;
  __l_02._M_len = 3;
  __l_02._M_array = &local_58;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)&local_b8,__l_02,&local_bb,&local_bc);
  addTrainDependencies
            (this,(set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   *)&local_88,
             (set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              *)&local_b8);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_b8);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_88);
  local_38.first = 5;
  local_38.second = 5;
  uStack_30 = 0x500000006;
  local_28 = 0x500000007;
  uStack_20 = 0x500000008;
  __l_03._M_len = 4;
  __l_03._M_array = &local_38;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)&local_88,__l_03,&local_b9,&local_ba);
  local_58.first = 2;
  local_58.second = 7;
  uStack_50 = 0x700000003;
  local_48 = 0x700000004;
  uStack_40 = 0x700000005;
  __l_04._M_len = 4;
  __l_04._M_array = &local_58;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)&local_b8,__l_04,&local_bb,&local_bc);
  addTrainDependencies
            (this,(set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   *)&local_88,
             (set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              *)&local_b8);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_b8);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return;
}

Assistant:

void TrainSudoku::addDependencies()
{
  Sudoku::addDependencies();
  
  std::cout<<"Add group dependencies"<<std::endl;

  // add group dependencies
  // Each row is one train (x,y) coordinates. The trains consist of the same numbers.
  
#if 0
  // 2
  addTrainDependencies(
    {{0, 0}, {1, 0}, {2, 0}},
    {{2, 4}, {3, 4}, {4, 4}}
  );

  // 3
  addTrainDependencies(
    {{3, 0}, {4, 0}, {5, 0}},
    {{5, 4}, {6, 4}, {7, 4}}
  );

  // 4
  addTrainDependencies(
    {{5, 2}, {6, 2}, {7, 2}, {8, 2}},
    {{1, 8}, {2, 8}, {3, 8}, {4, 8}}
  );


  // 5
  addTrainDependencies(
    {{0, 3}, {1, 3}, {2, 3}, {3, 3}},
    {{1, 6}, {2, 6}, {3, 6}, {4, 6}}
  );

#else
  // 2
  addTrainDependencies(
    {{3, 1}, {4, 1}, {5, 1}},
    {{0, 3}, {1, 3}, {2, 3}}
  );

  // 3
  addTrainDependencies(
    {{6, 1}, {7, 1}, {8, 1}},
    {{3, 3}, {4, 3}, {5, 3}}
  );

  // 4
  addTrainDependencies(
    {{5, 5}, {6, 5}, {7, 5}, {8, 5}},
    {{2, 7}, {3, 7}, {4, 7}, {5, 7}}
  );


if (false)
{

  // 5
  addTrainDependencies(
    {{1, 6}, {2, 6}, {3, 6}},
    {{2, 8}, {3, 8}, {4, 8}}
  );
}

#endif

  std::cout<<"done"<<std::endl;
}